

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_math.h
# Opt level: O0

uint crnlib::math::count_trailing_zero_bits(uint v)

{
  int local_14;
  uint local_10;
  int i;
  uint c;
  uint v_local;
  
  local_10 = 0x20;
  i = v;
  for (local_14 = 4; -1 < local_14; local_14 = local_14 + -1) {
    if ((i & count_trailing_zero_bits::B[local_14]) != 0) {
      i = i << ((byte)count_trailing_zero_bits::S[local_14] & 0x1f);
      local_10 = local_10 - count_trailing_zero_bits::S[local_14];
    }
  }
  if (i != 0) {
    local_10 = local_10 - 1;
  }
  return local_10;
}

Assistant:

inline uint count_trailing_zero_bits(uint v)
        {
            uint c = 32; // c will be the number of zero bits on the right

            static const unsigned int B[] = { 0x55555555, 0x33333333, 0x0F0F0F0F, 0x00FF00FF, 0x0000FFFF };
            static const unsigned int S[] = { 1, 2, 4, 8, 16 }; // Our Magic Binary Numbers

            for (int i = 4; i >= 0; --i) // unroll for more speed
            {
                if (v & B[i])
                {
                    v <<= S[i];
                    c -= S[i];
                }
            }

            if (v)
            {
                c--;
            }

            return c;
        }